

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::StringReader::preadx_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t offset,size_t size)

{
  uint8_t *puVar1;
  out_of_range *this_00;
  allocator<char> local_35 [13];
  size_t local_28;
  size_t size_local;
  size_t offset_local;
  StringReader *this_local;
  
  local_28 = size;
  size_local = offset;
  offset_local = (size_t)this;
  this_local = (StringReader *)__return_storage_ptr__;
  if (this->length < offset + size) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"not enough data to read");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  puVar1 = this->data;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)(puVar1 + offset),size,local_35);
  ::std::allocator<char>::~allocator(local_35);
  return __return_storage_ptr__;
}

Assistant:

string StringReader::preadx(size_t offset, size_t size) const {
  if (offset + size > this->length) {
    throw out_of_range("not enough data to read");
  }
  return string(reinterpret_cast<const char*>(this->data + offset), size);
}